

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsPublication
anon_unknown.dwarf_5d1c2::addPublication
          (HelicsFederate fed,
          unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
          *pub)

{
  bool bVar1;
  pointer pPVar2;
  __normal_iterator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_*,_std::vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>_>
  *__i;
  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
  *in_RSI;
  long in_RDI;
  __normal_iterator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_*,_std::vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>_>
  ind;
  HelicsPublication hpub;
  FedObject *fedObj;
  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
  *in_stack_ffffffffffffff88;
  const_iterator __position;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool bVar3;
  BaseType local_44;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *local_40;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *local_38;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *local_30;
  BaseType local_28;
  InterfaceHandle local_24;
  pointer local_20;
  long local_18;
  
  __position._M_current =
       (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *)
       in_RSI;
  local_18 = in_RDI;
  pPVar2 = std::
           unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
           operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                       *)0x1cba7f);
  pPVar2->valid = -0x684eff5b;
  local_20 = std::
             unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
             ::get((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                    *)in_RSI);
  bVar1 = std::
          vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
          ::empty((vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  bVar3 = true;
  if (!bVar1) {
    pPVar2 = std::
             unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
             ::operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                           *)0x1cbab9);
    local_24 = helics::Interface::getHandle(&pPVar2->pubPtr->super_Interface);
    std::
    vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
    ::back(in_RSI);
    pPVar2 = std::
             unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
             ::operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                           *)0x1cbadc);
    local_28 = (BaseType)helics::Interface::getHandle(&pPVar2->pubPtr->super_Interface);
    bVar3 = helics::InterfaceHandle::operator>(&local_24,(InterfaceHandle)local_28);
  }
  if (bVar3 == false) {
    local_38 = (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)std::
                  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
                  ::begin(in_stack_ffffffffffffff88);
    local_40 = (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)std::
                  vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
                  ::end(in_stack_ffffffffffffff88);
    pPVar2 = std::
             unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
             ::operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                           *)0x1cbb4d);
    local_44 = (BaseType)helics::Interface::getHandle(&pPVar2->pubPtr->super_Interface);
    local_30 = (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)std::
                  upper_bound<__gnu_cxx::__normal_iterator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>*,std::vector<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>,std::allocator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>>>,helics::InterfaceHandle,(anonymous_namespace)::__1>
                            (local_38,local_40,&local_44);
    __i = (__normal_iterator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_*,_std::vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>_>
           *)(local_18 + 0x68);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>const*,std::vector<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>,std::allocator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>>>>
    ::
    __normal_iterator<std::unique_ptr<helics::PublicationObject,std::default_delete<helics::PublicationObject>>*>
              ((__normal_iterator<const_std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_*,_std::vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>_>
                *)in_RSI,__i);
    std::
    vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
    ::insert(in_RSI,__position,(value_type *)__i);
  }
  else {
    std::
    vector<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>,_std::allocator<std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>_>_>
    ::push_back(in_RSI,(value_type *)in_stack_ffffffffffffff88);
  }
  return local_20;
}

Assistant:

HelicsPublication addPublication(HelicsFederate fed, std::unique_ptr<helics::PublicationObject> pub)
{
    auto* fedObj = reinterpret_cast<helics::FedObject*>(fed);
    pub->valid = PublicationValidationIdentifier;
    HelicsPublication hpub = pub.get();
    if (fedObj->pubs.empty() || pub->pubPtr->getHandle() > fedObj->pubs.back()->pubPtr->getHandle()) {
        fedObj->pubs.push_back(std::move(pub));
    } else {
        auto ind = std::upper_bound(fedObj->pubs.begin(), fedObj->pubs.end(), pub->pubPtr->getHandle(), pubSearch);
        fedObj->pubs.insert(ind, std::move(pub));
    }

    return hpub;
}